

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O2

RecyclerWeakReference<const_Js::PropertyRecord> * __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
::UncheckedInsert(WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
                  *this,RecyclerWeakReference<const_Js::PropertyRecord> *weakRef,
                 PropertyGuardEntry *value)

{
  hash_t key;
  code *pcVar1;
  bool bVar2;
  hash_t bucket;
  int iVar3;
  undefined4 *puVar4;
  RecyclerWeakReference<const_Js::PropertyRecord> *pRVar5;
  
  if ((this->buckets).ptr == (int *)0x0) {
    Initialize(this,0);
  }
  key = *(int *)((weakRef->super_RecyclerWeakReferenceBase).strongRef + 0xc) * 2 + 1;
  bucket = PrimePolicy::ModPrime(key,this->size,this->modFunctionIndex);
  iVar3 = FindEntry<Js::PropertyRecord>
                    (this,(PropertyRecord *)(weakRef->super_RecyclerWeakReferenceBase).strongRef);
  if (iVar3 != -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/Dictionary.h"
                       ,0x10a,"(FindEntry(weakRef->FastGet()) == -1)",
                       "FindEntry(weakRef->FastGet()) == -1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pRVar5 = Insert(this,weakRef,value,key,bucket);
  return pRVar5;
}

Assistant:

const RecyclerWeakReference<TKey>* UncheckedInsert(const RecyclerWeakReference<TKey>* weakRef, TValue value)
        {
            if (buckets == nullptr) Initialize(0);

            int hash = GetHashCode(weakRef->FastGet());
            uint bucket = PrimePolicy::GetBucket(hash, size, modFunctionIndex);

            Assert(FindEntry(weakRef->FastGet()) == -1);
            return Insert(weakRef, value, hash, bucket);
        }